

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,(unsigned_char)16>(Thread *this)

{
  difference_type __n;
  ulong uVar1;
  long lVar2;
  Simd<unsigned_char,_(unsigned_char)__x10_> SVar3;
  Simd<unsigned_char,_(unsigned_char)__x10_> val;
  uchar local_18 [16];
  
  SVar3 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  local_18[0] = SVar3.v[0];
  local_18[1] = SVar3.v[1];
  local_18[2] = SVar3.v[2];
  local_18[3] = SVar3.v[3];
  local_18[4] = SVar3.v[4];
  local_18[5] = SVar3.v[5];
  local_18[6] = SVar3.v[6];
  local_18[7] = SVar3.v[7];
  local_18[8] = SVar3.v[8];
  local_18[9] = SVar3.v[9];
  local_18[10] = SVar3.v[10];
  local_18[0xb] = SVar3.v[0xb];
  local_18[0xc] = SVar3.v[0xc];
  local_18[0xd] = SVar3.v[0xd];
  local_18[0xe] = SVar3.v[0xe];
  local_18[0xf] = SVar3.v[0xf];
  uVar1 = 0;
  lVar2 = 0;
  do {
    uVar1 = (uVar1 + 1) - (ulong)(local_18[lVar2] == '\0');
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  Push<bool>(this,0xf < uVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}